

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2vd_parser.c
# Opt level: O0

RK_U32 m2vd_search_header(BitReadCtx_t *bx)

{
  RK_S32 RVar1;
  uint uVar2;
  RK_U32 RVar3;
  BitReadCtx_t *bx_local;
  
  mpp_align_get_bits(bx);
  do {
    RVar1 = m2vd_show_bits(bx,0x18);
    if (RVar1 == 1) {
      RVar3 = m2vd_show_bits(bx,0x20);
      return RVar3;
    }
    mpp_skip_bits(bx,8);
    RVar1 = m2vd_get_leftbits(bx);
  } while (0x1f < RVar1);
  if ((m2vd_debug & 0x10) != 0) {
    uVar2 = m2vd_get_leftbits(bx);
    _mpp_log_l(4,"m2vd_parser","[m2v]: seach_header: str.leftbit()[%d] < 32",(char *)0x0,
               (ulong)uVar2);
  }
  return 0xffffffff;
}

Assistant:

static RK_U32 m2vd_search_header(BitReadCtx_t *bx)
{
    mpp_align_get_bits(bx);
    while (m2vd_show_bits(bx, 24) != 0x01) {
        mpp_skip_bits(bx, 8);
        if (m2vd_get_leftbits(bx) < 32) {
            if (M2VD_DBG_SEC_HEADER & m2vd_debug) {
                mpp_log("[m2v]: seach_header: str.leftbit()[%d] < 32", m2vd_get_leftbits(bx));
            }
            return NO_MORE_STREAM;
        }
    }
    return m2vd_show_bits(bx, 32);
}